

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall soplex::SPxBasisBase<double>::setRep(SPxBasisBase<double> *this)

{
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar1;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar2;
  
  reDim(this);
  this->minStab = 0.0;
  pDVar1 = &(this->thedesc).colstat;
  pDVar2 = &(this->thedesc).rowstat;
  if (this->theLP->theRep == ROW) {
    pDVar2 = pDVar1;
    pDVar1 = &(this->thedesc).rowstat;
  }
  (this->thedesc).stat = pDVar1;
  (this->thedesc).costat = pDVar2;
  return;
}

Assistant:

void SPxBasisBase<R>::setRep()
{
   assert(theLP != nullptr);

   reDim();
   minStab = 0.0;

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      thedesc.stat   = &thedesc.rowstat;
      thedesc.costat = &thedesc.colstat;
   }
   else
   {
      thedesc.stat   = &thedesc.colstat;
      thedesc.costat = &thedesc.rowstat;
   }
}